

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O3

void xsurv0_sock_init(void *arg,nni_sock *nsock)

{
  nni_msgq *pnVar1;
  
  nni_aio_init((nni_aio *)((long)arg + 0x18),xsurv0_sock_getq_cb,arg);
  nni_list_init_offset((nni_list *)arg,0x18);
  nni_mtx_init((nni_mtx *)((long)arg + 0x1f0));
  pnVar1 = nni_sock_sendq(nsock);
  *(nni_msgq **)((long)arg + 0x1e0) = pnVar1;
  pnVar1 = nni_sock_recvq(nsock);
  *(nni_msgq **)((long)arg + 0x1e8) = pnVar1;
  nni_atomic_init((nni_atomic_int *)((long)arg + 0x218));
  nni_atomic_set((nni_atomic_int *)((long)arg + 0x218),8);
  return;
}

Assistant:

static void
xsurv0_sock_init(void *arg, nni_sock *nsock)
{
	xsurv0_sock *s = arg;

	nni_aio_init(&s->aio_getq, xsurv0_sock_getq_cb, s);
	NNI_LIST_INIT(&s->pipes, xsurv0_pipe, node);
	nni_mtx_init(&s->mtx);

	s->uwq = nni_sock_sendq(nsock);
	s->urq = nni_sock_recvq(nsock);
	nni_atomic_init(&s->ttl);
	nni_atomic_set(&s->ttl, 8);
}